

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O1

int onigenc_utf16_32_get_ctype_code_range
              (OnigCtype ctype,OnigCodePoint *sb_out,OnigCodePoint **ranges)

{
  OnigCodePoint **ppOVar1;
  
  *sb_out = 0;
  if (ctype < 0x275) {
    ppOVar1 = CodeRanges + ctype;
  }
  else {
    if (UserDefinedPropertyNum <= (int)(ctype - 0x275)) {
      return -6;
    }
    ppOVar1 = &UserDefinedPropertyRanges[(int)(ctype - 0x275)].ranges;
  }
  *ranges = *ppOVar1;
  return 0;
}

Assistant:

extern int
onigenc_utf16_32_get_ctype_code_range(OnigCtype ctype, OnigCodePoint* sb_out,
                                      const OnigCodePoint* ranges[])
{
  *sb_out = 0x00;
  return onigenc_unicode_ctype_code_range(ctype, ranges);
}